

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryUint::test
          (ShaderBitfieldOperationCaseUnaryUint *this,Data *data)

{
  int iVar1;
  UnaryUFunc p_Var2;
  long lVar3;
  GLuint GVar4;
  uint uVar5;
  long lVar6;
  
  lVar3 = 0;
  do {
    lVar6 = lVar3;
    iVar1 = this->m_components;
    if (iVar1 <= lVar6) break;
    GVar4 = (*this->m_func)(data->inUvec4[lVar6]);
    uVar5 = data->outUvec4[lVar6];
    p_Var2 = this->m_func;
    if ((((p_Var2 == findMSBI) || (p_Var2 == findMSBU)) || (p_Var2 == bitCount)) ||
       (p_Var2 == findLSB)) {
      uVar5 = (int)(uVar5 << 0x17) >> 0x1f & 0xfffffe00U | uVar5 & 0x1ff;
    }
    lVar3 = lVar6 + 1;
  } while (uVar5 == GVar4);
  return iVar1 <= lVar6;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected = m_func(data->inUvec4[i]);
			GLuint output   = data->outUvec4[i];
			if (m_func == (UnaryUFunc)glcts::bitCount || m_func == (UnaryUFunc)glcts::findLSB ||
				m_func == (UnaryUFunc)glcts::findMSBU || m_func == (UnaryUFunc)glcts::findMSBI)
			{
				/* The built-in bitCount, findLSB and findMSB functions
				 * return a lowp int, which can be encoded with as little
				 * as 9 bits. Since findLSB and findMSB can return negative
				 * values (namely, -1), we cannot compare the value directly
				 * against a (32-bit) GLuint.
				 */
				GLuint output_9bits = output & 0x1ff;
				GLuint sign_extend  = output_9bits & 0x100 ? 0xfffffe00 : 0;
				output				= output_9bits | sign_extend;
			}

			if (output != expected)
			{
				return false;
			}
		}
		return true;
	}